

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O2

bool __thiscall CECorrections::DownloadTable(CECorrections *this,string *filename,string *url)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "CppEphem was not compiled with curl support. To download ");
  poVar1 = std::operator<<(poVar1,"the corrections file automatically, recompile with -DNOCURL=0.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool CECorrections::DownloadTable(const std::string& filename,
                                  const std::string& url) const
{
    bool success = true;
    #ifndef NOCURL
    try {
        CURL *curl;
        FILE *fp;
        CURLcode res;
        curl = curl_easy_init();                                                                                                                                                                                                                                                           
        if (curl)
        {   
            fp = fopen(filename.c_str(), "wb");
            curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
            curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, NULL);
            curl_easy_setopt(curl, CURLOPT_WRITEDATA, fp);
            res = curl_easy_perform(curl);
            curl_easy_cleanup(curl);
            fclose(fp);
            // TODO: handle the result
        }   
    } 
    // Catch exceptions that may happen
    catch (std::exception& e) {
        std::cerr << "ERROR trying to download corrections files: " 
                  << e.what() << std::endl;
        success = false;
    }
    #else
    std::cout << "CppEphem was not compiled with curl support. To download "
              << "the corrections file automatically, recompile with -DNOCURL=0."
              << std::endl;
    success = false;
    #endif

    return success;
}